

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O3

Type GradientBase32::fetchSingle(QGradientData *gradient,qreal v)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)(v * 1023.0 + 0.5);
  uVar2 = uVar1;
  if (0x3ff < uVar1) {
    if (gradient->spread == ReflectSpread) {
      uVar2 = uVar1 & 0x7ff;
      if (0x3ff < uVar2) {
        uVar2 = uVar2 ^ 0x7ff;
      }
    }
    else if (gradient->spread == RepeatSpread) {
      uVar2 = uVar1 & 0x3ff;
    }
    else {
      uVar2 = 0x3ff;
      if ((int)uVar1 < 0) {
        uVar2 = 0;
      }
    }
  }
  return gradient->colorTable32[uVar2];
}

Assistant:

static inline uint qt_gradient_pixel(const QGradientData *data, qreal pos)
{
    int ipos = int(pos * (GRADIENT_STOPTABLE_SIZE - 1) + qreal(0.5));
    return data->colorTable32[qt_gradient_clamp(data, ipos)];
}